

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMainMethod *stm)

{
  element_type *peVar1;
  CFieldList *pCVar2;
  CCompoundStm *pCVar3;
  mapped_type *pmVar4;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_40 [8];
  char local_38 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: mainmethod\n",0x18);
  peVar1 = (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50 = (undefined1  [8])local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"main","");
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&peVar1->methods,(key_type *)local_50);
  (this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pmVar4->super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(pmVar4->super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  if (local_50 != (undefined1  [8])local_40) {
    operator_delete((void *)local_50);
  }
  pCVar2 = (stm->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t
           .super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  if (pCVar2 != (CFieldList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
    TypeInfo::TypeInfo((TypeInfo *)local_50,VOID);
    (this->lastCalculatedType).isPrimitive = (bool)local_50[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_50._1_3_;
    (this->lastCalculatedType).type = local_50._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_48);
    if (local_48._M_p != local_38) {
      operator_delete(local_48._M_p);
    }
  }
  pCVar3 = (stm->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  if (pCVar3 != (CCompoundStm *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar3->super_IStatement).super_PositionedNode)(pCVar3,this);
    TypeInfo::TypeInfo((TypeInfo *)local_50,VOID);
    (this->lastCalculatedType).isPrimitive = (bool)local_50[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_50._1_3_;
    (this->lastCalculatedType).type = local_50._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_48);
    if (local_48._M_p != local_38) {
      operator_delete(local_48._M_p);
    }
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMainMethod &stm )
{
	std::cout << "typechecker: mainmethod\n";
    currentMethod = currentClass->methods["main"];
    if( stm.vars ) {
        stm.vars->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    }
    if( stm.statements ) {
        stm.statements->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    }
}